

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
* kj::
  newPromiseAndFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>::Connection>>
            (void)

{
  PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
  *pPVar1;
  PromiseNode *pPVar2;
  WeakFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
  *ptrCopy;
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
  *in_RDI;
  
  pPVar1 = (PromiseFulfiller<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
            *)operator_new(0x18);
  pPVar1->_vptr_PromiseFulfiller = (_func_int **)&PTR_fulfill_00633738;
  pPVar1[1]._vptr_PromiseFulfiller = (_func_int **)&DAT_00633768;
  pPVar1[2]._vptr_PromiseFulfiller = (_func_int **)0x0;
  pPVar2 = (PromiseNode *)operator_new(0x1a0);
  pPVar2[1]._vptr_PromiseNode = (_func_int **)0x0;
  pPVar2->_vptr_PromiseNode = (_func_int **)&PTR_onReady_006337f0;
  pPVar2[2]._vptr_PromiseNode = (_func_int **)&PTR_fulfill_00633838;
  *(undefined1 *)&pPVar2[3]._vptr_PromiseNode = 0;
  pPVar2[0x2f]._vptr_PromiseNode = (_func_int **)0x0;
  pPVar2[0x30]._vptr_PromiseNode = (_func_int **)0x0;
  *(undefined1 *)&pPVar2[0x31]._vptr_PromiseNode = 1;
  pPVar2[0x32]._vptr_PromiseNode = (_func_int **)(pPVar2 + 2);
  pPVar2[0x33]._vptr_PromiseNode = (_func_int **)pPVar1;
  pPVar1[2]._vptr_PromiseFulfiller = (_func_int **)(pPVar2 + 2);
  (in_RDI->promise).super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>::Connection>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>::Connection>>>>
        ::instance;
  (in_RDI->promise).super_PromiseBase.node.ptr = pPVar2;
  (in_RDI->fulfiller).disposer = (Disposer *)(pPVar1 + 1);
  (in_RDI->fulfiller).ptr = pPVar1;
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}